

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O3

int archive_read_append_filter(archive *_a,int code)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char str [20];
  char local_58 [32];
  char **local_38;
  
  switch(code) {
  case 0:
    goto switchD_001f0ebc_caseD_0;
  case 1:
    builtin_strncpy(local_58,"gzip",5);
    code = archive_read_support_filter_gzip(_a);
    break;
  case 2:
    builtin_strncpy(local_58,"bzip2",6);
    code = archive_read_support_filter_bzip2(_a);
    break;
  case 3:
    builtin_strncpy(local_58 + 8," (.Z)",6);
    builtin_strncpy(local_58,"compress",8);
    code = archive_read_support_filter_compress(_a);
    break;
  case 4:
    pcVar2 = "Cannot append program filter using archive_read_append_filter";
    goto LAB_001f1015;
  case 5:
    builtin_strncpy(local_58,"lzma",5);
    code = archive_read_support_filter_lzma(_a);
    break;
  case 6:
    local_58[2] = 0;
    local_58[0] = 'x';
    local_58[1] = 'z';
    code = archive_read_support_filter_xz(_a);
    break;
  case 7:
    local_58[2] = 0;
    local_58[0] = 'u';
    local_58[1] = 'u';
    code = archive_read_support_filter_uu(_a);
    break;
  case 8:
    builtin_strncpy(local_58,"rpm",4);
    code = archive_read_support_filter_rpm(_a);
    break;
  case 9:
    builtin_strncpy(local_58,"lzip",5);
    code = archive_read_support_filter_lzip(_a);
    break;
  case 10:
    builtin_strncpy(local_58,"lrzip",6);
    code = archive_read_support_filter_lrzip(_a);
    break;
  default:
    pcVar2 = "Invalid filter code specified";
    goto LAB_001f1015;
  }
  local_38 = &_a[8].compression_name;
  lVar3 = 0;
  do {
    pcVar2 = *(char **)((long)&_a[2].file_count + lVar3);
    if (pcVar2 == (char *)0x0) goto LAB_001f100e;
    iVar1 = strcmp(pcVar2,local_58);
    if (iVar1 == 0) {
      local_38 = (char **)((long)&_a[2].compression_name + lVar3);
      goto LAB_001f0fff;
    }
    lVar3 = lVar3 + 0x30;
  } while ((int)lVar3 != 0x2a0);
  pcVar2 = *(char **)&_a[8].file_count;
  if (pcVar2 != (char *)0x0) {
LAB_001f0fff:
    iVar1 = strcmp(pcVar2,local_58);
    if (iVar1 == 0) {
      pcVar2 = (char *)calloc(1,0xb0);
      if (pcVar2 != (char *)0x0) {
        *(char ***)(pcVar2 + 8) = local_38;
        *(archive **)(pcVar2 + 0x18) = _a;
        *(char **)(pcVar2 + 0x10) = _a[8].compression_name;
        _a[8].compression_name = pcVar2;
        iVar1 = (*(code *)((archive_string *)(local_38 + 3))->s)(pcVar2);
        if (iVar1 != 0) {
          __archive_read_close_filters((archive_read *)_a);
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
switchD_001f0ebc_caseD_0:
        _a[8].file_count = 1;
        return code >> 0x1f & code;
      }
      pcVar2 = "Out of memory";
      iVar1 = 0xc;
      goto LAB_001f101d;
    }
  }
LAB_001f100e:
  pcVar2 = "Internal error: Unable to append filter";
LAB_001f1015:
  iVar1 = 0x16;
LAB_001f101d:
  archive_set_error(_a,iVar1,pcVar2);
  return -0x1e;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r1 = r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 0; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter
        = (struct archive_read_filter *)calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_close_filters(a);
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}